

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O0

ConversionResult
convertUTF::ConvertUTF8toUTF32
          (UTF8 **sourceStart,UTF8 *sourceEnd,UTF32 **targetStart,UTF32 *targetEnd,
          ConversionFlags flags)

{
  byte bVar1;
  Boolean BVar2;
  uint uVar3;
  int local_44;
  uint8_t extraBytesToRead;
  uint *puStack_40;
  UTF32 ch;
  UTF32 *target;
  UTF8 *source;
  ConversionResult result;
  ConversionFlags flags_local;
  UTF32 *targetEnd_local;
  UTF32 **targetStart_local;
  UTF8 *sourceEnd_local;
  UTF8 **sourceStart_local;
  
  source._0_4_ = conversionOK;
  target = (UTF32 *)*sourceStart;
  puStack_40 = *targetStart;
  do {
    if (sourceEnd <= target) {
LAB_00295755:
      *sourceStart = (UTF8 *)target;
      *targetStart = puStack_40;
      return (ConversionResult)source;
    }
    local_44 = 0;
    bVar1 = trailingBytesForUTF8[(byte)*target];
    if (sourceEnd <= (UTF8 *)((long)target + (long)(int)(uint)bVar1)) {
      source._0_4_ = sourceExhausted;
      goto LAB_00295755;
    }
    BVar2 = anon_unknown_11::isLegalUTF8((UTF8 *)target,bVar1 + 1);
    if (!BVar2) {
      source._0_4_ = sourceIllegal;
      goto LAB_00295755;
    }
    switch(bVar1) {
    case 5:
      local_44 = (uint)(byte)*target << 6;
      target = (UTF32 *)((long)target + 1);
    case 4:
      local_44 = ((uint)(byte)*target + local_44) * 0x40;
      target = (UTF32 *)((long)target + 1);
    case 3:
      local_44 = ((uint)(byte)*target + local_44) * 0x40;
      target = (UTF32 *)((long)target + 1);
    case 2:
      local_44 = ((uint)(byte)*target + local_44) * 0x40;
      target = (UTF32 *)((long)target + 1);
    case 1:
      local_44 = ((uint)(byte)*target + local_44) * 0x40;
      target = (UTF32 *)((long)target + 1);
    case 0:
      local_44 = (uint)(byte)*target + local_44;
      target = (UTF32 *)((long)target + 1);
    }
    uVar3 = local_44 - *(int *)(offsetsFromUTF8 + (ulong)bVar1 * 4);
    if (targetEnd <= puStack_40) {
      target = (UTF32 *)((long)target - (long)(int)(bVar1 + 1));
      source._0_4_ = targetExhausted;
      goto LAB_00295755;
    }
    if (uVar3 < 0x110000) {
      if ((uVar3 < 0xd800) || (0xdfff < uVar3)) {
        *puStack_40 = uVar3;
      }
      else {
        if (flags == strictConversion) {
          target = (UTF32 *)((long)target - (long)(int)(bVar1 + 1));
          source._0_4_ = sourceIllegal;
          goto LAB_00295755;
        }
        *puStack_40 = 0xfffd;
      }
    }
    else {
      source._0_4_ = sourceIllegal;
      *puStack_40 = 0xfffd;
    }
    puStack_40 = puStack_40 + 1;
  } while( true );
}

Assistant:

ConversionResult ConvertUTF8toUTF32(const UTF8** sourceStart, const UTF8* sourceEnd, UTF32** targetStart,
                                    const UTF32* targetEnd, const ConversionFlags flags)
{
    ConversionResult result = ConversionResult::conversionOK;
    const UTF8* source = *sourceStart;
    UTF32* target = *targetStart;
    while (source < sourceEnd)
    {
        UTF32 ch = 0;
        const uint8_t extraBytesToRead = trailingBytesForUTF8[*source];
        if (source + extraBytesToRead >= sourceEnd)
        {
            result = ConversionResult::sourceExhausted;
            break;
        }
        /* Do this check whether lenient or strict */
        if (!isLegalUTF8(source, extraBytesToRead + 1))
        {
            result = ConversionResult::sourceIllegal;
            break;
        }
        /*
         * The cases all fall through. See "Note A" below.
         */
        switch (extraBytesToRead)
        {
        case 5:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 4:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 3:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 2:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 1:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 0:
            ch += *source++;
            break;
        default:;
        }
        ch -= offsetsFromUTF8[extraBytesToRead];

        if (target >= targetEnd)
        {
            source -= (extraBytesToRead + 1); /* Back up the source pointer! */
            result = ConversionResult::targetExhausted;
            break;
        }
        if (ch <= UNI_MAX_LEGAL_UTF32)
        {
            /*
             * UTF-16 surrogate values are illegal in UTF-32, and anything
             * over Plane 17 (> 0x10FFFF) is illegal.
             */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END)
            {
                if (flags == ConversionFlags::strictConversion)
                {
                    source -= (extraBytesToRead + 1); /* return to the illegal value itself */
                    result = ConversionResult::sourceIllegal;
                    break;
                }
                *target++ = UNI_REPLACEMENT_CHAR;
            }
            else
            {
                *target++ = ch;
            }
        }
        else
        { /* i.e., ch > UNI_MAX_LEGAL_UTF32 */
            result = ConversionResult::sourceIllegal;
            *target++ = UNI_REPLACEMENT_CHAR;
        }
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}